

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O3

int LZWPreDecode(TIFF *tif,uint16_t s)

{
  uint8_t *puVar1;
  long lVar2;
  
  puVar1 = tif->tif_data;
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                  ,0xfb,"int LZWPreDecode(TIFF *, uint16_t)");
  }
  lVar2 = *(long *)(puVar1 + 0xe8);
  if (lVar2 == 0) {
    (*tif->tif_setupdecode)(tif);
    lVar2 = *(long *)(puVar1 + 0xe8);
    if (lVar2 == 0) {
      return 0;
    }
  }
  if (((tif->tif_rawcc < 2) || (*tif->tif_rawdata != '\0')) || ((tif->tif_rawdata[1] & 1) == 0)) {
    puVar1[0x82] = 0xfe;
    puVar1[0x83] = '\x01';
    *(code **)(puVar1 + 0xc0) = LZWDecode;
  }
  else {
    if (*(long *)(puVar1 + 0xc0) == 0) {
      TIFFWarningExtR(tif,"LZWPreDecode","Old-style LZW codes, convert file");
      tif->tif_decoderow = LZWDecodeCompat;
      tif->tif_decodestrip = LZWDecodeCompat;
      tif->tif_decodetile = LZWDecodeCompat;
      (*tif->tif_setupdecode)(tif);
      *(code **)(puVar1 + 0xc0) = LZWDecodeCompat;
      lVar2 = *(long *)(puVar1 + 0xe8);
    }
    puVar1[0x82] = 0xff;
    puVar1[0x83] = '\x01';
  }
  puVar1[0x80] = '\t';
  puVar1[0x81] = '\0';
  puVar1[0xa8] = '\0';
  puVar1[0xa9] = '\0';
  puVar1[0xaa] = '\0';
  puVar1[0xab] = '\0';
  puVar1[0xac] = '\0';
  puVar1[0xad] = '\0';
  puVar1[0xae] = '\0';
  puVar1[0xaf] = '\0';
  puVar1[0x88] = '\0';
  puVar1[0x89] = '\0';
  puVar1[0x8a] = '\0';
  puVar1[0x8b] = '\0';
  puVar1[0x8c] = '\0';
  puVar1[0x8d] = '\0';
  puVar1[0x8e] = '\0';
  puVar1[0x8f] = '\0';
  puVar1[0x90] = '\0';
  puVar1[0x91] = '\0';
  puVar1[0x92] = '\0';
  puVar1[0x93] = '\0';
  puVar1[0x94] = '\0';
  puVar1[0x95] = '\0';
  puVar1[0x96] = '\0';
  puVar1[0x97] = '\0';
  puVar1[0xa0] = 0xff;
  puVar1[0xa1] = '\x01';
  puVar1[0xa2] = '\0';
  puVar1[0xa3] = '\0';
  puVar1[0xa4] = '\0';
  puVar1[0xa5] = '\0';
  puVar1[0xa6] = '\0';
  puVar1[0xa7] = '\0';
  puVar1[0xb0] = '\0';
  puVar1[0xb1] = '\0';
  puVar1[0xb2] = '\0';
  puVar1[0xb3] = '\0';
  puVar1[0xb4] = '\0';
  puVar1[0xb5] = '\0';
  puVar1[0xb6] = '\0';
  puVar1[0xb7] = '\0';
  puVar1[0xb8] = '\0';
  puVar1[0xb9] = '\0';
  puVar1[0xba] = '\0';
  puVar1[0xbb] = '\0';
  puVar1[0xbc] = '\0';
  puVar1[0xbd] = '\0';
  puVar1[0xbe] = '\0';
  puVar1[0xbf] = '\0';
  *(long *)(puVar1 + 0xd8) = lVar2 + -0x10;
  *(long *)(puVar1 + 0xd0) = lVar2;
  *(long *)(puVar1 + 0xe0) = lVar2 + 0x1fe0;
  puVar1[0xf0] = '\0';
  puVar1[0xf1] = '\0';
  puVar1[0xf2] = '\0';
  puVar1[0xf3] = '\0';
  return 1;
}

Assistant:

static int LZWPreDecode(TIFF *tif, uint16_t s)
{
    static const char module[] = "LZWPreDecode";
    LZWCodecState *sp = DecoderState(tif);

    (void)s;
    assert(sp != NULL);
    if (sp->dec_codetab == NULL)
    {
        tif->tif_setupdecode(tif);
        if (sp->dec_codetab == NULL)
            return (0);
    }

    /*
     * Check for old bit-reversed codes.
     */
    if (tif->tif_rawcc >= 2 && tif->tif_rawdata[0] == 0 &&
        (tif->tif_rawdata[1] & 0x1))
    {
#ifdef LZW_COMPAT
        if (!sp->dec_decode)
        {
            TIFFWarningExtR(tif, module, "Old-style LZW codes, convert file");
            /*
             * Override default decoding methods with
             * ones that deal with the old coding.
             * Otherwise the predictor versions set
             * above will call the compatibility routines
             * through the dec_decode method.
             */
            tif->tif_decoderow = LZWDecodeCompat;
            tif->tif_decodestrip = LZWDecodeCompat;
            tif->tif_decodetile = LZWDecodeCompat;
            /*
             * If doing horizontal differencing, must
             * re-setup the predictor logic since we
             * switched the basic decoder methods...
             */
            (*tif->tif_setupdecode)(tif);
            sp->dec_decode = LZWDecodeCompat;
        }
        sp->lzw_maxcode = MAXCODE(BITS_MIN);
#else  /* !LZW_COMPAT */
        if (!sp->dec_decode)
        {
            TIFFErrorExtR(tif, module, "Old-style LZW codes not supported");
            sp->dec_decode = LZWDecode;
        }
        return (0);
#endif /* !LZW_COMPAT */
    }
    else
    {
        sp->lzw_maxcode = MAXCODE(BITS_MIN) - 1;
        sp->dec_decode = LZWDecode;
    }
    sp->lzw_nbits = BITS_MIN;
    sp->lzw_nextbits = 0;
    sp->lzw_nextdata = 0;

    sp->dec_restart = 0;
    sp->dec_nbitsmask = MAXCODE(BITS_MIN);
    sp->dec_bitsleft = 0;
    sp->old_tif_rawcc = 0;
    sp->dec_free_entp = sp->dec_codetab - 1; // + CODE_FIRST;
    /*
     * Zero entries that are not yet filled in.  We do
     * this to guard against bogus input data that causes
     * us to index into undefined entries.  If you can
     * come up with a way to safely bounds-check input codes
     * while decoding then you can remove this operation.
     */
    sp->dec_oldcodep = &sp->dec_codetab[0];
    sp->dec_maxcodep = &sp->dec_codetab[sp->dec_nbitsmask - 1];
    sp->read_error = 0;
    return (1);
}